

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProduct.cpp
# Opt level: O2

void __thiscall mnf::CartesianProduct::forceOnM_(CartesianProduct *this,RefVec *out,ConstRefVec *in)

{
  long *plVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong i;
  long lVar3;
  RefVec local_f8;
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> local_e0 [24];
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> local_c8 [24];
  void *local_b0;
  DenseBase<Eigen::Block<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
  local_a0 [56];
  DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
  local_68 [56];
  
  lVar3 = 0;
  i = 0;
  while( true ) {
    iVar2 = (*(this->super_Manifold)._vptr_Manifold[7])(this);
    if (CONCAT44(extraout_var,iVar2) <= i) break;
    plVar1 = *(long **)((long)&(((this->subManifolds_).
                                 super__Vector_base<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super___shared_ptr<const_mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr + lVar3);
    local_f8.
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
    _0_8_ = *(undefined8 *)
             &out->
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
    ;
    local_f8.
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
    _8_8_ = *(undefined8 *)
             &(out->
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              ).field_0x8;
    local_f8.
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
    _16_1_ = (out->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
             ).field_0x10;
    Manifold::getView<0>((Segment *)local_68,&this->super_Manifold,&local_f8,i);
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
              (local_e0,local_68,(type *)0x0);
    Manifold::getConstView<0>((ConstSegment *)local_a0,&this->super_Manifold,in,i);
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>const,_1,1,false>>
              (local_c8,local_a0,(type *)0x0);
    (**(code **)(*plVar1 + 0x18))(plVar1,local_e0,local_c8);
    free(local_b0);
    i = i + 1;
    lVar3 = lVar3 + 0x10;
  }
  return;
}

Assistant:

void CartesianProduct::forceOnM_(RefVec out, const ConstRefVec& in) const
{
  for (std::size_t i = 0; i < numberOfSubManifolds(); ++i)
    subManifolds_[i]->forceOnM(getView<R>(out, i), getConstView<R>(in, i));
}